

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseComponent.h
# Opt level: O1

void BaseComponent::Publish<std::__cxx11::string>
               (UserEvent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *ev)

{
  key_type *__k;
  int iVar1;
  Type TVar2;
  undefined8 in_RAX;
  mapped_type *pmVar3;
  undefined8 uVar4;
  ulong uVar5;
  Type type;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&eventsLock);
  if (iVar1 == 0) {
    TVar2 = Event::GetType(&ev->super_Event);
    __k = (key_type *)((long)&uStack_28 + 4);
    uStack_28 = CONCAT44(TVar2,(undefined4)uStack_28);
    uVar5 = 0;
    while( true ) {
      pmVar3 = std::__detail::
               _Map_base<int,_std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>,_std::allocator<std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>,_std::allocator<std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&events,__k);
      if ((ulong)((long)(pmVar3->
                        super__Vector_base<BaseComponent_*,_std::allocator<BaseComponent_*>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(pmVar3->
                        super__Vector_base<BaseComponent_*,_std::allocator<BaseComponent_*>_>).
                        _M_impl.super__Vector_impl_data._M_start >> 3) <= uVar5) {
        pthread_mutex_unlock((pthread_mutex_t *)&eventsLock);
        return;
      }
      pmVar3 = std::__detail::
               _Map_base<int,_std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>,_std::allocator<std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>,_std::allocator<std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&events,__k);
      if ((pmVar3->super__Vector_base<BaseComponent_*,_std::allocator<BaseComponent_*>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar5] == (BaseComponent *)0x0) break;
      pmVar3 = std::__detail::
               _Map_base<int,_std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>,_std::allocator<std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>,_std::allocator<std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&events,__k);
      AddEvent<std::__cxx11::string>
                ((pmVar3->super__Vector_base<BaseComponent_*,_std::allocator<BaseComponent_*>_>).
                 _M_impl.super__Vector_impl_data._M_start[uVar5],ev);
      uVar5 = uVar5 + 1;
    }
    iVar1 = __cxa_rethrow();
  }
  uVar4 = std::__throw_system_error(iVar1);
  pthread_mutex_unlock((pthread_mutex_t *)&eventsLock);
  _Unwind_Resume(uVar4);
}

Assistant:

static void Publish(const UserEvent<T> &ev) {
            std::lock_guard<std::mutex> lock(eventsLock);
            Event::Type type = ev.GetType();

            for(size_t i = 0; i < events[type].size(); ++i) {
                if(events[type][i] == nullptr) {
                    throw;
                }

                events[type][i]->AddEvent<T>(ev);
            }
        }